

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.hpp
# Opt level: O1

NodeChildren * __thiscall
duckdb::BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::ExtractChildren
          (NodeChildren *__return_storage_ptr__,
          BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *this,ArenaAllocator *arena)

{
  uchar uVar1;
  data_ptr_t ptr_p;
  Node *pNVar2;
  uchar *puVar3;
  idx_t idx;
  array_ptr<duckdb::Node,_true> children_ptr;
  array_ptr<unsigned_char,_true> bytes;
  array_ptr<duckdb::Node,_true> local_50;
  array_ptr<unsigned_char,_true> local_40;
  
  ptr_p = ArenaAllocator::AllocateAligned(arena,(ulong)this->count);
  array_ptr<unsigned_char,_true>::array_ptr(&local_40,ptr_p,(ulong)this->count);
  pNVar2 = (Node *)ArenaAllocator::AllocateAligned(arena,(ulong)this->count << 3);
  array_ptr<duckdb::Node,_true>::array_ptr(&local_50,pNVar2,(ulong)this->count);
  if (this->count != '\0') {
    idx = 0;
    do {
      uVar1 = this->key[idx];
      puVar3 = array_ptr<unsigned_char,_true>::operator[](&local_40,idx);
      *puVar3 = uVar1;
      pNVar2 = array_ptr<duckdb::Node,_true>::operator[](&local_50,idx);
      (pNVar2->super_IndexPointer).data = this->children[idx].super_IndexPointer.data;
      idx = idx + 1;
    } while (idx < this->count);
  }
  this->count = '\0';
  (__return_storage_ptr__->bytes).ptr = local_40.ptr;
  (__return_storage_ptr__->bytes).count = local_40.count;
  (__return_storage_ptr__->children).ptr = local_50.ptr;
  (__return_storage_ptr__->children).count = local_50.count;
  return __return_storage_ptr__;
}

Assistant:

NodeChildren ExtractChildren(ArenaAllocator &arena) {
		auto mem_bytes = arena.AllocateAligned(sizeof(uint8_t) * count);
		array_ptr<uint8_t> bytes(mem_bytes, count);
		auto mem_children = arena.AllocateAligned(sizeof(Node) * count);
		array_ptr<Node> children_ptr(reinterpret_cast<Node *>(mem_children), count);

		for (uint8_t i = 0; i < count; i++) {
			bytes[i] = key[i];
			children_ptr[i] = children[i];
		}

		count = 0;
		return NodeChildren(bytes, children_ptr);
	}